

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer.cpp
# Opt level: O0

token * __thiscall
argo::pointer::translate_uri_token
          (token *__return_storage_ptr__,pointer *this,string *pointer,size_t *start,size_t *end)

{
  size_t sVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  json_pointer_exception *pjVar5;
  char local_60;
  int c;
  string local_50 [8];
  string translated;
  size_t *end_local;
  size_t *start_local;
  string *pointer_local;
  pointer *this_local;
  
  std::__cxx11::string::string(local_50);
  *start = *start + 1;
  pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)pointer);
  if (*pcVar4 != '/') {
    pjVar5 = (json_pointer_exception *)__cxa_allocate_exception(0xd8);
    json_pointer_exception::json_pointer_exception
              (pjVar5,syntax_error_in_pointer_string_e,(int)*start + -1);
    __cxa_throw(pjVar5,&json_pointer_exception::typeinfo,
                json_pointer_exception::~json_pointer_exception);
  }
  while( true ) {
    while( true ) {
      if (*end <= *start) {
        make_token(__return_storage_ptr__,this,(string *)local_50);
        std::__cxx11::string::~string(local_50);
        return __return_storage_ptr__;
      }
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)pointer);
      if (*pcVar4 == '~') break;
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)pointer);
      if (*pcVar4 == '%') {
        sVar1 = *start;
        *start = sVar1 + 1;
        if (*end - 1 <= sVar1 + 1) {
          pjVar5 = (json_pointer_exception *)__cxa_allocate_exception(0xd8);
          json_pointer_exception::json_pointer_exception
                    (pjVar5,syntax_error_in_pointer_string_e,(int)*start + -1);
          __cxa_throw(pjVar5,&json_pointer_exception::typeinfo,
                      json_pointer_exception::~json_pointer_exception);
        }
        sVar1 = *start;
        *start = sVar1 + 1;
        iVar2 = from_hex(this,pointer,sVar1);
        sVar1 = *start;
        *start = sVar1 + 1;
        iVar3 = from_hex(this,pointer,sVar1);
        local_60 = (char)iVar2 * '\x10' + (char)iVar3;
        std::__cxx11::string::operator+=(local_50,local_60);
      }
      else {
        *start = *start + 1;
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)pointer);
        std::__cxx11::string::operator+=(local_50,*pcVar4);
      }
    }
    sVar1 = *start;
    *start = sVar1 + 1;
    if (*end <= sVar1 + 1) break;
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)pointer);
    if (*pcVar4 == '0') {
      std::__cxx11::string::operator+=(local_50,'~');
    }
    else {
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)pointer);
      if (*pcVar4 != '1') {
        pjVar5 = (json_pointer_exception *)__cxa_allocate_exception(0xd8);
        json_pointer_exception::json_pointer_exception
                  (pjVar5,syntax_error_in_pointer_string_e,(int)*start + -1);
        __cxa_throw(pjVar5,&json_pointer_exception::typeinfo,
                    json_pointer_exception::~json_pointer_exception);
      }
      std::__cxx11::string::operator+=(local_50,'/');
    }
    *start = *start + 1;
  }
  pjVar5 = (json_pointer_exception *)__cxa_allocate_exception(0xd8);
  json_pointer_exception::json_pointer_exception
            (pjVar5,syntax_error_in_pointer_string_e,(int)*start + -1);
  __cxa_throw(pjVar5,&json_pointer_exception::typeinfo,
              json_pointer_exception::~json_pointer_exception);
}

Assistant:

pointer::token pointer::translate_uri_token(const string &pointer, size_t &start, size_t &end)
{
    string translated;

    if (pointer[start++] == '/')
    {
        while (start < end)
        {
            if (pointer[start] == '~')
            {
                if (++start < end)
                {
                    if (pointer[start] == '0')
                    {
                        translated += '~';
                    }
                    else if (pointer[start] == '1')
                    {
                        translated += '/';
                    }
                    else
                    {
                        throw json_pointer_exception(json_exception::syntax_error_in_pointer_string_e, start - 1);
                    }
                    start++;
                }
                else
                {
                    throw json_pointer_exception(json_exception::syntax_error_in_pointer_string_e, start - 1);
                }
            }
            else if (pointer[start] == '%')
            {
                if (++start < (end - 1))
                {
                    int c = from_hex(pointer, start++) * 16;
                    c += from_hex(pointer, start++);
                    translated += static_cast<char>(c);
                }
                else
                {
                    throw json_pointer_exception(json_exception::syntax_error_in_pointer_string_e, start - 1);
                }
            }
            else
            {
                translated += pointer[start++];
            }
        }

        return make_token(translated);
    }
    else
    {
        throw json_pointer_exception(json_exception::syntax_error_in_pointer_string_e, start - 1);
    }
}